

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void anon_unknown.dwarf_5db41::parse_config_file(string *config_filename,string *program_name)

{
  bool bVar1;
  __type _Var2;
  istream *piVar3;
  long lVar4;
  ostream *poVar5;
  allocator local_2d9;
  string line;
  string local_2b8;
  string section;
  string argval;
  string argname;
  ifstream in;
  
  std::__cxx11::string::string((string *)&section,"*",(allocator *)&in);
  bVar1 = GEO::FileSystem::is_file(config_filename);
  if (bVar1) {
    std::ifstream::ifstream(&in,(config_filename->_M_dataplus)._M_p,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_0013e9da:
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (((line._M_string_length < 3) || (*line._M_dataplus._M_p != '[')) ||
         (line._M_dataplus._M_p[line._M_string_length - 1] != ']')) {
        _Var2 = std::operator==(&section,program_name);
        if (!_Var2) goto code_r0x0013ea61;
        goto LAB_0013ea78;
      }
      std::__cxx11::string::substr((ulong)&argval,(ulong)&line);
      GEO::String::to_uppercase(&argname,&argval);
      std::__cxx11::string::operator=((string *)&section,(string *)&argname);
      std::__cxx11::string::~string((string *)&argname);
      std::__cxx11::string::~string((string *)&argval);
    }
    (anonymous_namespace)::loaded_config_file = 1;
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&in);
  }
  std::__cxx11::string::~string((string *)&section);
  return;
code_r0x0013ea61:
  bVar1 = std::operator==(&section,"*");
  if (bVar1) {
LAB_0013ea78:
    lVar4 = std::__cxx11::string::find((char *)&line,0x191557);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&argname,(ulong)&line);
      std::__cxx11::string::substr((ulong)&argval,(ulong)&line);
      bVar1 = GEO::CmdLine::arg_is_declared(&argname);
      if (bVar1) {
        GEO::CmdLine::set_arg(&argname,&argval);
      }
      else {
        if ((anonymous_namespace)::auto_create_args == '\x01') {
          std::__cxx11::string::string((string *)&local_2b8,"...",&local_2d9);
          GEO::CmdLine::declare_arg(&argname,&argval,&local_2b8,ARG_FLAGS_DEFAULT);
        }
        else {
          std::__cxx11::string::string((string *)&local_2b8,"config",&local_2d9);
          poVar5 = GEO::Logger::warn(&local_2b8);
          poVar5 = std::operator<<(poVar5,(string *)&argname);
          poVar5 = std::operator<<(poVar5,"=");
          poVar5 = std::operator<<(poVar5,(string *)&argval);
          poVar5 = std::operator<<(poVar5," ignored");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      std::__cxx11::string::~string((string *)&argval);
      std::__cxx11::string::~string((string *)&argname);
    }
  }
  goto LAB_0013e9da;
}

Assistant:

void parse_config_file(
	const std::string& config_filename, const std::string& program_name
    ) {
	std::string section = "*";
	if(FileSystem::is_file(config_filename)) {
	    std::ifstream in(config_filename.c_str());
	    std::string line;
	    while(std::getline(in,line)) {
		if(line.length() >= 3 && line[0] == '[' && line[line.length()-1] == ']') {
		    section = String::to_uppercase(line.substr(1,line.length()-2));
		} else if(section == program_name || section == "*") {
		    size_t pos = line.find("=");
		    if(pos != std::string::npos) {
			std::string argname = line.substr(0,pos);
			std::string argval  = line.substr(pos+1,line.length()-pos-1);
			if(CmdLine::arg_is_declared(argname)) {
			    CmdLine::set_arg(argname, argval);
			} else {
			    if(auto_create_args) {
				CmdLine::declare_arg(argname, argval, "...");
			    } else {
				Logger::warn("config") << argname
						       << "=" << argval
						       << " ignored"
						       << std::endl;
			    }
			}
		    }
		}
	    }
	    loaded_config_file= true;
	}
    }